

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binning.cpp
# Opt level: O0

vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_true> *
duckdb::EquiWidthBinsTimestamp::Operation
          (Expression *expr,timestamp_t input_min,timestamp_t input_max,idx_t bin_count,
          bool nice_rounding)

{
  interval_t interval;
  interval_t step_00;
  interval_t iVar1;
  bool bVar2;
  undefined8 uVar3;
  size_type sVar4;
  timestamp_t in_RCX;
  timestamp_t in_RDX;
  idx_t in_RSI;
  Expression *in_RDI;
  ulong in_R8;
  byte in_R9B;
  int iVar5;
  undefined4 uVar8;
  undefined1 auVar7 [16];
  timestamp_t timestamp_val;
  interval_t step;
  double overflow_days;
  double overflow_months;
  double step_micros;
  double step_days;
  double step_months;
  interval_t interval_diff;
  int32_t max_micros;
  int32_t max_sec;
  int32_t max_minute;
  int32_t max_hour;
  int32_t max_day;
  int32_t max_month;
  int32_t max_year;
  int32_t min_micros;
  int32_t min_sec;
  int32_t min_minute;
  int32_t min_hour;
  int32_t min_day;
  int32_t min_month;
  int32_t min_year;
  PrimitiveType<long> *val;
  iterator __end3;
  iterator __begin3;
  vector<duckdb::PrimitiveType<long>,_true> *__range3;
  vector<duckdb::PrimitiveType<long>,_true> interpolated_values;
  vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_true> *result;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  int *piVar9;
  vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
  *in_stack_fffffffffffffde0;
  vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
  *this;
  undefined8 in_stack_fffffffffffffdf0;
  int32_t in_stack_fffffffffffffdf8;
  int32_t in_stack_fffffffffffffdfc;
  int32_t *in_stack_fffffffffffffe00;
  double dVar10;
  int32_t *in_stack_fffffffffffffe08;
  int32_t micros;
  int32_t *in_stack_fffffffffffffe10;
  int32_t *in_stack_fffffffffffffe18;
  timestamp_t in_stack_fffffffffffffe20;
  allocator *paVar11;
  Expression *sec;
  int32_t *in_stack_fffffffffffffe38;
  string *in_stack_fffffffffffffe40;
  Expression *in_stack_fffffffffffffe48;
  InvalidInputException *in_stack_fffffffffffffe50;
  PrimitiveType<duckdb::timestamp_t> local_1a0;
  undefined1 local_191;
  vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
  *local_190;
  int64_t local_188;
  timestamp_t local_180;
  undefined8 local_178;
  long local_170;
  interval_t local_168;
  undefined8 local_158;
  int64_t iStack_150;
  double local_148;
  double local_140;
  double local_138;
  double local_130;
  double local_128;
  int local_120;
  int local_11c;
  long local_118;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  timestamp_t local_c8;
  PrimitiveType<duckdb::timestamp_t> local_c0;
  reference local_b8;
  PrimitiveType<long> *local_b0;
  __normal_iterator<duckdb::PrimitiveType<long>_*,_std::vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>_>
  local_a8;
  undefined1 *local_a0;
  undefined1 local_91;
  undefined1 local_90 [27];
  undefined1 local_75;
  allocator local_61;
  string local_60 [55];
  byte local_29;
  Expression *expr_00;
  undefined1 auVar6 [16];
  
  local_29 = in_R9B & 1;
  sec = in_RDI;
  expr_00 = in_RDI;
  bVar2 = duckdb::Value::IsFinite<duckdb::timestamp_t>(in_RDX);
  if ((bVar2) && (bVar2 = duckdb::Value::IsFinite<duckdb::timestamp_t>(in_RCX), bVar2)) {
    if ((local_29 & 1) == 0) {
      EquiWidthBinsInteger::Operation
                (expr_00,in_RDX.value,in_RCX.value,in_RSI,SUB81(in_R8 >> 0x38,0));
      local_91 = 0;
      vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_true>::vector
                ((vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_true> *)0xd4352e);
      local_a0 = local_90;
      local_a8._M_current =
           (PrimitiveType<long> *)
           std::vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>::
           begin((vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
                  *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      local_b0 = (PrimitiveType<long> *)
                 std::
                 vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
                 ::end((vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
                        *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<duckdb::PrimitiveType<long>_*,_std::vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>_>
                                 *)in_stack_fffffffffffffde0,
                                (__normal_iterator<duckdb::PrimitiveType<long>_*,_std::vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8)),
            bVar2) {
        local_b8 = __gnu_cxx::
                   __normal_iterator<duckdb::PrimitiveType<long>_*,_std::vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>_>
                   ::operator*(&local_a8);
        timestamp_t::timestamp_t(&local_c8,local_b8->val);
        PrimitiveType<duckdb::timestamp_t>::PrimitiveType(&local_c0,local_c8);
        std::
        vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
        ::push_back(in_stack_fffffffffffffde0,
                    (value_type *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
        __gnu_cxx::
        __normal_iterator<duckdb::PrimitiveType<long>_*,_std::vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>_>
        ::operator++(&local_a8);
      }
      local_91 = 1;
      vector<duckdb::PrimitiveType<long>,_true>::~vector
                ((vector<duckdb::PrimitiveType<long>,_true> *)0xd4364d);
    }
    else {
      GetTimestampComponents
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                 in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                 (int32_t *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                 (int32_t *)sec,in_stack_fffffffffffffe38);
      piVar9 = &local_fc;
      GetTimestampComponents
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                 in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                 (int32_t *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                 (int32_t *)sec,in_stack_fffffffffffffe38);
      micros = (int32_t)in_stack_fffffffffffffe10;
      local_120 = (local_ec - local_d0) + (local_e8 - local_cc) * 0xc;
      local_11c = local_f0 - local_d4;
      local_118 = (long)(local_f4 - local_d8) * 3600000000 + (long)(local_f8 - local_dc) * 60000000
                  + (long)(local_fc - local_e0) * 1000000 + (long)(local_100 - local_e4);
      uVar8 = (undefined4)(in_R8 >> 0x20);
      auVar6._8_4_ = uVar8;
      auVar6._0_8_ = in_R8;
      auVar6._12_4_ = 0x45300000;
      iVar5 = (int)in_R8;
      dVar10 = (double)local_120 /
               ((auVar6._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,iVar5) - 4503599627370496.0));
      local_130 = (double)local_11c / (double)iVar5;
      auVar7._8_4_ = uVar8;
      auVar7._0_8_ = in_R8;
      auVar7._12_4_ = 0x45300000;
      local_138 = (double)local_118 /
                  ((auVar7._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,iVar5) - 4503599627370496.0));
      local_128 = dVar10;
      if (0.0 < dVar10) {
        local_140 = floor(dVar10);
        local_140 = dVar10 - local_140;
        local_130 = local_140 * 30.0 + local_130;
      }
      if (0.0 < local_130) {
        dVar10 = local_130;
        local_148 = floor(local_130);
        local_148 = dVar10 - local_148;
        local_138 = local_148 * 86400000000.0 + local_138;
      }
      uVar8 = (undefined4)((ulong)piVar9 >> 0x20);
      local_158 = (vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
                   *)CONCAT44((int)local_130,(int)local_128);
      local_170 = (long)local_138;
      local_178 = local_158;
      interval.micros._0_4_ = (int)piVar9;
      interval.months = 0xd439a7;
      interval.days = 0;
      interval.micros._4_4_ = uVar8;
      iStack_150 = local_170;
      local_168 = MakeIntervalNice(interval);
      local_158 = (vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
                   *)local_168._0_8_;
      iStack_150 = local_168.micros;
      local_190 = (vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
                   *)local_168._0_8_;
      local_188 = local_168.micros;
      step_00.micros = in_stack_fffffffffffffe20.value;
      step_00._0_8_ = in_stack_fffffffffffffe18;
      this = (vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
              *)local_168._0_8_;
      local_180 = MakeTimestampNice(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8,
                                    (int32_t)((ulong)in_stack_fffffffffffffdf0 >> 0x20),
                                    (int32_t)in_stack_fffffffffffffdf0,local_168.micros._4_4_,
                                    (int32_t)local_168.micros,micros,step_00);
      if ((((int)local_158 < 1) && (local_158._4_4_ < 1)) && (iStack_150 < 1)) {
        local_158 = (vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
                     *)0x0;
        iStack_150 = 1;
      }
      local_191 = 0;
      vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_true>::vector
                ((vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_true> *)0xd43aa8);
      iVar5 = local_100;
      while( true ) {
        bVar2 = false;
        if (in_RDX.value <= local_180.value) {
          sVar4 = std::
                  vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
                  ::size((vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
                          *)in_RDI);
          bVar2 = sVar4 < in_R8;
        }
        if (!bVar2) break;
        PrimitiveType<duckdb::timestamp_t>::PrimitiveType(&local_1a0,local_180);
        std::
        vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
        ::push_back(this,(value_type *)CONCAT44(uVar8,iVar5));
        iVar1.micros = iStack_150;
        iVar1._0_8_ = local_158;
        local_180 = duckdb::SubtractOperator::
                    Operation<duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t>
                              (local_180,iVar1);
      }
    }
    return (vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_true> *)sec;
  }
  local_75 = 1;
  uVar3 = __cxa_allocate_exception(0x10);
  paVar11 = &local_61;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_60,"equi_width_bucket does not support infinite or nan as min/max value",paVar11)
  ;
  InvalidInputException::InvalidInputException<>
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  local_75 = 0;
  __cxa_throw(uVar3,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException);
}

Assistant:

static vector<PrimitiveType<timestamp_t>> Operation(const Expression &expr, timestamp_t input_min,
	                                                    timestamp_t input_max, idx_t bin_count, bool nice_rounding) {
		if (!Value::IsFinite(input_min) || !Value::IsFinite(input_max)) {
			throw InvalidInputException(expr, "equi_width_bucket does not support infinite or nan as min/max value");
		}

		if (!nice_rounding) {
			// if we are not doing nice rounding it is pretty simple - just interpolate between the timestamp values
			auto interpolated_values =
			    EquiWidthBinsInteger::Operation(expr, input_min.value, input_max.value, bin_count, false);

			vector<PrimitiveType<timestamp_t>> result;
			for (auto &val : interpolated_values) {
				result.push_back(timestamp_t(val.val));
			}
			return result;
		}
		// fetch the components of the timestamps
		int32_t min_year, min_month, min_day, min_hour, min_minute, min_sec, min_micros;
		int32_t max_year, max_month, max_day, max_hour, max_minute, max_sec, max_micros;
		GetTimestampComponents(input_min, min_year, min_month, min_day, min_hour, min_minute, min_sec, min_micros);
		GetTimestampComponents(input_max, max_year, max_month, max_day, max_hour, max_minute, max_sec, max_micros);

		// get the interval differences per component
		// note: these can be negative (except for the largest non-zero difference)
		interval_t interval_diff;
		interval_diff.months = (max_year - min_year) * Interval::MONTHS_PER_YEAR + (max_month - min_month);
		interval_diff.days = max_day - min_day;
		interval_diff.micros = (max_hour - min_hour) * Interval::MICROS_PER_HOUR +
		                       (max_minute - min_minute) * Interval::MICROS_PER_MINUTE +
		                       (max_sec - min_sec) * Interval::MICROS_PER_SEC + (max_micros - min_micros);

		double step_months = static_cast<double>(interval_diff.months) / static_cast<double>(bin_count);
		double step_days = static_cast<double>(interval_diff.days) / static_cast<int32_t>(bin_count);
		double step_micros = static_cast<double>(interval_diff.micros) / static_cast<double>(bin_count);
		// since we truncate the months/days, propagate any fractional component to the unit below (i.e. 0.2 months
		// becomes 6 days)
		if (step_months > 0) {
			double overflow_months = step_months - std::floor(step_months);
			step_days += overflow_months * Interval::DAYS_PER_MONTH;
		}
		if (step_days > 0) {
			double overflow_days = step_days - std::floor(step_days);
			step_micros += overflow_days * Interval::MICROS_PER_DAY;
		}
		interval_t step;
		step.months = static_cast<int32_t>(step_months);
		step.days = static_cast<int32_t>(step_days);
		step.micros = static_cast<int64_t>(step_micros);

		// now we make the max, and the step nice
		step = MakeIntervalNice(step);
		timestamp_t timestamp_val =
		    MakeTimestampNice(max_year, max_month, max_day, max_hour, max_minute, max_sec, max_micros, step);
		if (step.months <= 0 && step.days <= 0 && step.micros <= 0) {
			// interval must be at least one microsecond
			step.months = step.days = 0;
			step.micros = 1;
		}

		vector<PrimitiveType<timestamp_t>> result;
		while (timestamp_val.value >= input_min.value && result.size() < bin_count) {
			result.push_back(timestamp_val);
			timestamp_val = SubtractOperator::Operation<timestamp_t, interval_t, timestamp_t>(timestamp_val, step);
		}
		return result;
	}